

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_process_anchor(yaml_emitter_t *emitter)

{
  size_t sVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  char *indicator;
  byte *pbVar5;
  byte *pbVar6;
  
  if ((emitter->anchor_data).anchor != (yaml_char_t *)0x0) {
    indicator = "*";
    if ((emitter->anchor_data).alias == 0) {
      indicator = "&";
    }
    iVar4 = yaml_emitter_write_indicator(emitter,indicator,1,0,0);
    if (iVar4 == 0) {
      return 0;
    }
    sVar1 = (emitter->anchor_data).anchor_length;
    if (sVar1 != 0) {
      pbVar5 = (emitter->anchor_data).anchor;
      pbVar6 = pbVar5 + sVar1;
      do {
        if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
           (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
          return 0;
        }
        bVar3 = *pbVar5;
        if ((char)bVar3 < '\0') {
          if ((bVar3 & 0xe0) == 0xc0) {
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = pbVar5[1];
            pbVar5 = pbVar5 + 2;
            goto LAB_0010a7bb;
          }
          if ((bVar3 & 0xf0) == 0xe0) {
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = pbVar5[1];
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = pbVar5[2];
            pbVar5 = pbVar5 + 3;
            goto LAB_0010a7bb;
          }
          if ((bVar3 & 0xf8) == 0xf0) {
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = pbVar5[1];
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = pbVar5[2];
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = pbVar5[3];
            pbVar5 = pbVar5 + 4;
            goto LAB_0010a7bb;
          }
        }
        else {
          pbVar5 = pbVar5 + 1;
LAB_0010a7bb:
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
        }
        emitter->column = emitter->column + 1;
      } while (pbVar5 != pbVar6);
    }
    emitter->whitespace = 0;
    emitter->indention = 0;
  }
  return 1;
}

Assistant:

static int
yaml_emitter_process_anchor(yaml_emitter_t *emitter)
{
    if (!emitter->anchor_data.anchor)
        return 1;

    if (!yaml_emitter_write_indicator(emitter,
                (emitter->anchor_data.alias ? "*" : "&"), 1, 0, 0))
        return 0;

    return yaml_emitter_write_anchor(emitter,
            emitter->anchor_data.anchor, emitter->anchor_data.anchor_length);
}